

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytes.c
# Opt level: O2

adt_bytes_t * adt_bytes_new(uint8_t *dataBuf,uint32_t dataLen)

{
  adt_error_t aVar1;
  adt_bytes_t *self;
  
  self = (adt_bytes_t *)malloc(0x10);
  if (self != (adt_bytes_t *)0x0) {
    aVar1 = adt_bytes_create(self,dataBuf,dataLen);
    if (aVar1 == '\0') {
      return self;
    }
    free(self);
  }
  return (adt_bytes_t *)0x0;
}

Assistant:

adt_bytes_t *adt_bytes_new(const uint8_t *dataBuf, uint32_t dataLen)
{
   adt_bytes_t *self = (adt_bytes_t*) malloc(sizeof(adt_bytes_t));
   if (self != 0)
   {
      adt_error_t result = adt_bytes_create(self, dataBuf, dataLen);
      if (result != ADT_NO_ERROR)
      {
         free(self);
         self = (adt_bytes_t*) 0;
      }
   }
   return self;
}